

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

bool __thiscall
ZAP::Archive::getData(Archive *this,Entry *entry,char **return_data,size_t *return_size)

{
  istream *piVar1;
  bool bVar2;
  Compression compression;
  char *local_48;
  char *data;
  __mbstate_t local_38;
  size_t *local_30;
  size_t *return_size_local;
  char **return_data_local;
  Entry *entry_local;
  Archive *this_local;
  
  if ((entry == (Entry *)0x0) ||
     (local_30 = return_size, return_size_local = (size_t *)return_data,
     return_data_local = (char **)entry, entry_local = (Entry *)this,
     bVar2 = isSupportedCompression(this), !bVar2)) {
    return false;
  }
  if ((*(int *)(return_data_local + 5) != 0) && (*(int *)((long)return_data_local + 0x24) != 0)) {
    piVar1 = this->stream;
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&data,(ulong)*(uint *)(return_data_local + 4))
    ;
    std::istream::seekg(piVar1,data,local_38);
    local_48 = (char *)operator_new__((ulong)*(uint *)(return_data_local + 5));
    std::istream::read((char *)this->stream,(long)local_48);
    compression = getCompression(this);
    bVar2 = decompress(compression,&local_48,*(uint32_t *)(return_data_local + 5),
                       *(uint32_t *)((long)return_data_local + 0x24));
    if (!bVar2) {
      if (local_48 != (char *)0x0) {
        operator_delete__(local_48);
      }
      return false;
    }
    *return_size_local = (size_t)local_48;
    *local_30 = (ulong)*(uint *)((long)return_data_local + 0x24);
    return true;
  }
  return false;
}

Assistant:

bool Archive::getData(const Entry *entry, char *&return_data, std::size_t &return_size) const
	{
		if (entry == nullptr || !isSupportedCompression())
			return false;

		if (entry->compressed_size == 0 || entry->decompressed_size == 0)
			return false;

		stream->seekg(entry->index);

		char *data = new char[entry->compressed_size];
		stream->read(data, entry->compressed_size);

		if (!decompress(getCompression(), data, entry->compressed_size, entry->decompressed_size))
		{
			delete[] data;
			return false;
		}

		return_data = data;
		return_size = entry->decompressed_size;
		return true;
	}